

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib509.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long local_48;
  char *str;
  int asize;
  CURL *curl;
  CURLcode res;
  undefined8 uStack_26;
  uchar a [14];
  char *URL_local;
  
  uStack_26 = 0x913f3e3d3c3b3a2f;
  a[0] = 0xa2;
  a[1] = 0xb3;
  a[2] = 0xc4;
  a[3] = 0xd5;
  a[4] = 0xe6;
  a[5] = 0xf7;
  local_48 = 0;
  a._6_8_ = URL;
  iVar1 = curl_global_init_mem
                    (3,custom_malloc,custom_free,custom_realloc,custom_strdup,custom_calloc);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      URL_local._4_4_ = curl_easy_setopt(lVar2,0x2722,"test509");
      if (URL_local._4_4_ == 0) {
        local_48 = curl_easy_escape(lVar2,&stack0xffffffffffffffda,0xe);
      }
      if (local_48 != 0) {
        curl_free(local_48);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init_mem() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                       0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res;
  CURL *curl;
  int asize;
  char *str = NULL;

  (void)URL;

  res = curl_global_init_mem(CURL_GLOBAL_ALL,
                             custom_malloc,
                             custom_free,
                             custom_realloc,
                             custom_strdup,
                             custom_calloc);
  if(res != CURLE_OK) {
    fprintf(stderr, "curl_global_init_mem() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_USERAGENT, "test509"); /* uses strdup() */

  asize = (int)sizeof(a);
  str = curl_easy_escape(curl, (char *)a, asize); /* uses realloc() */

test_cleanup:

  if(str)
    curl_free(str);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}